

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O0

void init_ctrade_array(vector<Trade,_std::allocator<Trade>_> *c,
                      vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_> *trades)

{
  size_type __new_size;
  value_type *pvVar1;
  reference c_00;
  const_reference trade;
  value_type *p2;
  value_type *p1;
  size_t i;
  vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_> *trades_local;
  vector<Trade,_std::allocator<Trade>_> *c_local;
  
  __new_size = std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>::size(trades);
  std::vector<Trade,_std::allocator<Trade>_>::resize(c,__new_size);
  p1 = (value_type *)0x0;
  while( true ) {
    pvVar1 = (value_type *)
             std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>::size(trades);
    if (pvVar1 <= p1) break;
    c_00 = std::vector<Trade,_std::allocator<Trade>_>::operator[](c,(size_type)p1);
    trade = std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>::operator[]
                      (trades,(size_type)p1);
    init_ctrade(c_00,trade);
    p1 = (value_type *)((long)&p1->account_id + 1);
  }
  return;
}

Assistant:

void init_ctrade_array(vector<Trade>* c, const vector<tquant::api::Trade>* trades)
{
    c->resize(trades->size());
    for (size_t i =0; i < trades->size(); i++) {
        auto p1 = &(*c)[i];
        auto p2 = &(*trades)[i];
        init_ctrade(p1, p2);
    }
}